

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O1

void __thiscall avro::Name::check(Name *this)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = (this->ns_)._M_string_length;
  if (uVar2 != 0) {
    pcVar7 = (this->ns_)._M_dataplus._M_p;
    if ((*pcVar7 == '.') || (pcVar7[uVar2 - 1] == '.')) goto LAB_0018092d;
    pcVar6 = pcVar7 + uVar2;
    pcVar8 = pcVar7;
    if (0 < (long)uVar2 >> 2) {
      pcVar8 = pcVar7 + (uVar2 & 0xfffffffffffffffc);
      lVar9 = ((long)uVar2 >> 2) + 1;
      pcVar7 = pcVar7 + 3;
      do {
        cVar1 = pcVar7[-3];
        iVar3 = isalnum((int)cVar1);
        if (((iVar3 == 0) && (cVar1 != '_')) && (cVar1 != '.')) {
          pcVar7 = pcVar7 + -3;
          goto LAB_00180728;
        }
        cVar1 = pcVar7[-2];
        iVar3 = isalnum((int)cVar1);
        if (((iVar3 == 0) && (cVar1 != '_')) && (cVar1 != '.')) {
          pcVar7 = pcVar7 + -2;
          goto LAB_00180728;
        }
        cVar1 = pcVar7[-1];
        iVar3 = isalnum((int)cVar1);
        if (((iVar3 == 0) && (cVar1 != '_')) && (cVar1 != '.')) {
          pcVar7 = pcVar7 + -1;
          goto LAB_00180728;
        }
        cVar1 = *pcVar7;
        iVar3 = isalnum((int)cVar1);
        if (((iVar3 == 0) && (cVar1 != '_')) && (cVar1 != '.')) goto LAB_00180728;
        lVar9 = lVar9 + -1;
        pcVar7 = pcVar7 + 4;
      } while (1 < lVar9);
    }
    lVar9 = (long)pcVar6 - (long)pcVar8;
    if (lVar9 == 1) {
LAB_00180705:
      iVar5 = (int)*pcVar8;
      iVar3 = isalnum(iVar5);
      if (iVar3 != 0) {
        pcVar8 = pcVar6;
      }
      if (iVar5 == 0x5f) {
        pcVar8 = pcVar6;
      }
      pcVar7 = pcVar8;
      if (iVar5 == 0x2e) {
        pcVar7 = pcVar6;
      }
    }
    else if (lVar9 == 2) {
LAB_001806ee:
      cVar1 = *pcVar8;
      iVar3 = isalnum((int)cVar1);
      if (((iVar3 != 0) || (cVar1 == '_')) || (pcVar7 = pcVar8, cVar1 == '.')) {
        pcVar8 = pcVar8 + 1;
        goto LAB_00180705;
      }
    }
    else {
      pcVar7 = pcVar6;
      if (lVar9 == 3) {
        cVar1 = *pcVar8;
        iVar3 = isalnum((int)cVar1);
        if (((iVar3 != 0) || (cVar1 == '_')) || (pcVar7 = pcVar8, cVar1 == '.')) {
          pcVar8 = pcVar8 + 1;
          goto LAB_001806ee;
        }
      }
    }
LAB_00180728:
    if (pcVar7 != pcVar6) {
LAB_0018092d:
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
      std::operator+(&local_50,"Invalid namespace: ",&this->ns_);
      std::runtime_error::runtime_error((runtime_error *)(puVar4 + 1),(string *)&local_50);
      *puVar4 = 0x1cd6f0;
      puVar4[1] = 0x1cd720;
      __cxa_throw(puVar4,&Exception::typeinfo,Exception::~Exception);
    }
  }
  uVar2 = (this->simpleName_)._M_string_length;
  if (uVar2 == 0) goto LAB_001808c5;
  pcVar6 = (this->simpleName_)._M_dataplus._M_p;
  pcVar7 = pcVar6 + uVar2;
  pcVar8 = pcVar6;
  if (0 < (long)uVar2 >> 2) {
    pcVar8 = pcVar6 + (uVar2 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar2 >> 2) + 1;
    pcVar6 = pcVar6 + 3;
    do {
      cVar1 = pcVar6[-3];
      iVar3 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar3 == 0)) {
        pcVar6 = pcVar6 + -3;
        goto LAB_0018085d;
      }
      cVar1 = pcVar6[-2];
      iVar3 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar3 == 0)) {
        pcVar6 = pcVar6 + -2;
        goto LAB_0018085d;
      }
      cVar1 = pcVar6[-1];
      iVar3 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar3 == 0)) {
        pcVar6 = pcVar6 + -1;
        goto LAB_0018085d;
      }
      cVar1 = *pcVar6;
      iVar3 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar3 == 0)) goto LAB_0018085d;
      lVar9 = lVar9 + -1;
      pcVar6 = pcVar6 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar7 - (long)pcVar8;
  if (lVar9 == 1) {
LAB_00180830:
    cVar1 = *pcVar8;
    iVar3 = isalnum((int)cVar1);
    if (iVar3 != 0) {
      pcVar8 = pcVar7;
    }
    pcVar6 = pcVar8;
    if (cVar1 == 0x5f) {
      pcVar6 = pcVar7;
    }
  }
  else if (lVar9 == 2) {
LAB_00180818:
    cVar1 = *pcVar8;
    iVar3 = isalnum((int)cVar1);
    if ((cVar1 == 0x5f) || (pcVar6 = pcVar8, iVar3 != 0)) {
      pcVar8 = pcVar8 + 1;
      goto LAB_00180830;
    }
  }
  else {
    pcVar6 = pcVar7;
    if ((lVar9 == 3) &&
       ((cVar1 = *pcVar8, iVar3 = isalnum((int)cVar1), cVar1 == 0x5f ||
        (pcVar6 = pcVar8, iVar3 != 0)))) {
      pcVar8 = pcVar8 + 1;
      goto LAB_00180818;
    }
  }
LAB_0018085d:
  if (pcVar6 == pcVar7) {
    return;
  }
LAB_001808c5:
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::operator+(&local_50,"Invalid name: ",&this->simpleName_);
  std::runtime_error::runtime_error((runtime_error *)(puVar4 + 1),(string *)&local_50);
  *puVar4 = 0x1cd6f0;
  puVar4[1] = 0x1cd720;
  __cxa_throw(puVar4,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Name::check() const
{
    if (! ns_.empty() && (ns_[0] == '.' || ns_[ns_.size() - 1] == '.' || std::find_if(ns_.begin(), ns_.end(), invalidChar1) != ns_.end())) {
        throw Exception("Invalid namespace: " + ns_);
    }
    if (simpleName_.empty() || std::find_if(simpleName_.begin(), simpleName_.end(), invalidChar2) != simpleName_.end()) {
        throw Exception("Invalid name: " + simpleName_);
    }
}